

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O1

void __thiscall qpdf::Tokenizer::presentEOF(Tokenizer *this)

{
  token_type_e tVar1;
  
  switch(this->state) {
  case st_top:
  case st_before_token:
    this->type = tt_eof;
    break;
  default:
    this->type = tt_bad;
    std::__cxx11::string::_M_replace
              ((ulong)&this->error_message,0,(char *)(this->error_message)._M_string_length,0x280774
              );
    break;
  case st_name:
  case st_literal:
  case st_sign:
  case st_number:
  case st_real:
  case st_decimal:
  case st_name_hex1:
  case st_name_hex2:
    presentCharacter(this,'\f');
    this->in_token = true;
    break;
  case st_in_space:
    tVar1 = this->include_ignorable | tt_eof;
    goto LAB_001e63f4;
  case st_in_comment:
    tVar1 = (uint)this->include_ignorable << 4;
LAB_001e63f4:
    this->type = tVar1;
    break;
  case st_token_ready:
    break;
  }
  this->state = st_token_ready;
  return;
}

Assistant:

void
Tokenizer::presentEOF()
{
    switch (state) {
    case st_name:
    case st_name_hex1:
    case st_name_hex2:
    case st_number:
    case st_real:
    case st_sign:
    case st_decimal:
    case st_literal:
        QTC::TC("qpdf", "QPDFTokenizer EOF reading appendable token");
        // Push any delimiter to the state machine to finish off the final token.
        presentCharacter('\f');
        in_token = true;
        break;

    case st_top:
    case st_before_token:
        type = tt::tt_eof;
        break;

    case st_in_space:
        type = include_ignorable ? tt::tt_space : tt::tt_eof;
        break;

    case st_in_comment:
        type = include_ignorable ? tt::tt_comment : tt::tt_bad;
        break;

    case st_token_ready:
        break;

    default:
        QTC::TC("qpdf", "QPDFTokenizer EOF reading token");
        type = tt::tt_bad;
        error_message = "EOF while reading token";
    }
    state = st_token_ready;
}